

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

archive * archive_write_disk_new(void)

{
  __mode_t __mask;
  __uid_t _Var1;
  archive *__s;
  archive_vtable_conflict *paVar2;
  char *pcVar3;
  archive_string *paVar4;
  archive_write_disk *a;
  archive_string *in_stack_fffffffffffffff8;
  
  __s = (archive *)malloc(0x2e8);
  if (__s == (archive *)0x0) {
    __s = (archive *)0x0;
  }
  else {
    memset(__s,0,0x2e8);
    __s->magic = 0xc001b0c5;
    __s->state = 2;
    paVar2 = archive_write_disk_vtable();
    __s->vtable = paVar2;
    pcVar3 = (char *)time((time_t *)0x0);
    __s[1].error = pcVar3;
    __mask = umask(0);
    __s[1].magic = __mask;
    umask(__mask);
    _Var1 = geteuid();
    __s[1].archive_format_name = (char *)(ulong)_Var1;
    paVar4 = archive_string_ensure(in_stack_fffffffffffffff8,(size_t)__s);
    if (paVar4 == (archive_string *)0x0) {
      free(__s);
      __s = (archive *)0x0;
    }
    else {
      *(undefined4 *)((long)&__s[6].error_string.s + 4) = 5;
    }
  }
  return __s;
}

Assistant:

struct archive *
archive_write_disk_new(void)
{
	struct archive_write_disk *a;

	a = (struct archive_write_disk *)malloc(sizeof(*a));
	if (a == NULL)
		return (NULL);
	memset(a, 0, sizeof(*a));
	a->archive.magic = ARCHIVE_WRITE_DISK_MAGIC;
	/* We're ready to write a header immediately. */
	a->archive.state = ARCHIVE_STATE_HEADER;
	a->archive.vtable = archive_write_disk_vtable();
	a->start_time = time(NULL);
	/* Query and restore the umask. */
	umask(a->user_umask = umask(0));
#ifdef HAVE_GETEUID
	a->user_uid = geteuid();
#endif /* HAVE_GETEUID */
	if (archive_string_ensure(&a->path_safe, 512) == NULL) {
		free(a);
		return (NULL);
	}
#ifdef HAVE_ZLIB_H
	a->decmpfs_compression_level = 5;
#endif
	return (&a->archive);
}